

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadListOp<tinyusdz::Reference>
          (CrateReader *this,ListOp<tinyusdz::Reference> *d)

{
  bool bVar1;
  ostream *poVar2;
  ListOpHeader h;
  ostringstream ss_e;
  byte local_1b9;
  vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> local_1b8 [17];
  
  local_1b9 = 0;
  bVar1 = StreamReader::read1(this->_sr,&local_1b9);
  if (bVar1) {
    if ((local_1b9 & 1) != 0) {
      ListOp<tinyusdz::Reference>::ClearAndMakeExplicit(d);
    }
    if ((local_1b9 & 2) != 0) {
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = ReadArray<tinyusdz::Reference>(this,local_1b8);
      if (bVar1) {
        ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::operator=
                  (&d->explicit_items,local_1b8);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector(local_1b8);
      if (!bVar1) goto LAB_0018d793;
    }
    if ((local_1b9 & 4) != 0) {
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = ReadArray<tinyusdz::Reference>(this,local_1b8);
      if (bVar1) {
        ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::operator=
                  (&d->added_items,local_1b8);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector(local_1b8);
      if (!bVar1) goto LAB_0018d793;
    }
    if ((local_1b9 & 0x20) != 0) {
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = ReadArray<tinyusdz::Reference>(this,local_1b8);
      if (bVar1) {
        ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::operator=
                  (&d->prepended_items,local_1b8);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector(local_1b8);
      if (!bVar1) goto LAB_0018d793;
    }
    if ((local_1b9 & 0x40) != 0) {
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = ReadArray<tinyusdz::Reference>(this,local_1b8);
      if (bVar1) {
        ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::operator=
                  (&d->appended_items,local_1b8);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector(local_1b8);
      if (!bVar1) goto LAB_0018d793;
    }
    if ((local_1b9 & 8) != 0) {
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = ReadArray<tinyusdz::Reference>(this,local_1b8);
      if (bVar1) {
        ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::operator=
                  (&d->deleted_items,local_1b8);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector(local_1b8);
      if (!bVar1) goto LAB_0018d793;
    }
    if ((local_1b9 & 0x10) != 0) {
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8[0].super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = ReadArray<tinyusdz::Reference>(this,local_1b8);
      if (bVar1) {
        ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::operator=
                  (&d->ordered_items,local_1b8);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector(local_1b8);
      if (!bVar1) goto LAB_0018d793;
    }
    bVar1 = true;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    poVar2 = ::std::operator<<((ostream *)local_1b8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadListOp");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x660);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1b8,"Failed to read ListOpHeader.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
LAB_0018d793:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CrateReader::ReadListOp(ListOp<T> *d) {
  // read ListOpHeader
  ListOpHeader h;
  if (!_sr->read1(&h.bits)) {
    PUSH_ERROR("Failed to read ListOpHeader.");
    return false;
  }

  if (h.IsExplicit()) {
    d->ClearAndMakeExplicit();
  }

  //
  // NOTE: array data is not compressed even for Int type
  //

  if (h.HasExplicitItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::ExplicitItems.\n";
      return false;
    }

    d->SetExplicitItems(items);
  }

  if (h.HasAddedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::AddedItems.\n";
      return false;
    }

    d->SetAddedItems(items);
  }

  if (h.HasPrependedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::PrependedItems.\n";
      return false;
    }

    d->SetPrependedItems(items);
  }

  if (h.HasAppendedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::AppendedItems.\n";
      return false;
    }

    d->SetAppendedItems(items);
  }

  if (h.HasDeletedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::DeletedItems.\n";
      return false;
    }

    d->SetDeletedItems(items);
  }

  if (h.HasOrderedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::OrderedItems.\n";
      return false;
    }

    d->SetOrderedItems(items);
  }

  return true;
}